

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall ktxValidator::validateDataSize(ktxValidator *this,validationContext *ctx)

{
  ulong uVar1;
  int *piVar2;
  long *in_RSI;
  off_t dataEnd;
  off_t dataStart;
  uint64_t dataSizeInFile;
  issue *in_stack_ffffffffffffff08;
  issue *in_stack_ffffffffffffff10;
  issue local_d0;
  char *in_stack_ffffffffffffff58;
  issue *in_stack_ffffffffffffff60;
  severity in_stack_ffffffffffffff6c;
  ktxValidator *in_stack_ffffffffffffff70;
  fpos local_80 [16];
  streamoff local_70;
  fpos local_30 [16];
  streamoff local_20;
  long local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_30 = (fpos  [16])std::istream::tellg();
  local_20 = std::fpos::operator_cast_to_long(local_30);
  std::istream::seekg(*local_10,_S_beg);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) != 0) {
    ::issue::issue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    piVar2 = __errno_location();
    strerror(*piVar2);
    addIssue<char*>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff58);
    ::issue::~issue((issue *)0x1115da);
  }
  local_80 = (fpos  [16])std::istream::tellg();
  local_70 = std::fpos::operator_cast_to_long(local_80);
  if (local_70 < 0) {
    ::issue::issue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    piVar2 = __errno_location();
    strerror(*piVar2);
    addIssue<char*>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff58);
    ::issue::~issue((issue *)0x111681);
  }
  local_18 = local_70 - local_20;
  if (local_18 != local_10[0x10]) {
    ::issue::issue(&local_d0,in_stack_ffffffffffffff08);
    addIssue<>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
    ::issue::~issue((issue *)0x11170d);
  }
  return;
}

Assistant:

void
ktxValidator::validateDataSize(validationContext& ctx)
{
    // Expects to be called after validateSgd so current file offset is at
    // the start of the data.
    uint64_t dataSizeInFile;
    off_t dataStart = (off_t)(ctx.inp->tellg());

    ctx.inp->seekg(0, ios_base::end);
    if (ctx.inp->fail())
        addIssue(logger::eFatal, IOError.FileSeekEndFailure,
                 strerror(errno));
    off_t dataEnd = (off_t)(ctx.inp->tellg());
    if (dataEnd < 0)
        addIssue(logger::eFatal, IOError.FileTellFailure, strerror(errno));
    dataSizeInFile = dataEnd - dataStart;
    if (dataSizeInFile != ctx.dataSizeFromLevelIndex)
        addIssue(logger::eError, FileError.IncorrectDataSize);
}